

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
UA_Client_deleteNode(UA_Client *client,UA_NodeId nodeId,UA_Boolean deleteTargetReferences)

{
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  UA_DiagnosticInfo **local_f0;
  undefined1 local_e0 [8];
  UA_DeleteNodesResponse response;
  
  local_f0 = &response.diagnosticInfos;
  response.diagnosticInfos = (UA_DiagnosticInfo *)nodeId._0_8_;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_f8 = 1;
  __UA_Client_Service(client,&local_168,UA_TYPES + 0x4d,local_e0,UA_TYPES + 0x80);
  if ((response.responseHeader.timestamp._4_4_ == 0) &&
     (response.responseHeader.timestamp._4_4_ = 0x80010000,
     response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1)) {
    response.responseHeader.timestamp._4_4_ = *(UA_StatusCode *)response.resultsSize;
  }
  deleteMembers_noInit(local_e0,UA_TYPES + 0x80);
  memset(local_e0,0,0xa8);
  return response.responseHeader.timestamp._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_deleteNode(UA_Client *client, const UA_NodeId nodeId,
                     UA_Boolean deleteTargetReferences) {
    UA_DeleteNodesItem item;
    UA_DeleteNodesItem_init(&item);
    item.nodeId = nodeId;
    item.deleteTargetReferences = deleteTargetReferences;
    UA_DeleteNodesRequest request;
    UA_DeleteNodesRequest_init(&request);
    request.nodesToDelete = &item;
    request.nodesToDeleteSize = 1;
    UA_DeleteNodesResponse response = UA_Client_Service_deleteNodes(client, request);
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval != UA_STATUSCODE_GOOD) {
        UA_DeleteNodesResponse_deleteMembers(&response);
        return retval;
    }
    if(response.resultsSize != 1) {
        UA_DeleteNodesResponse_deleteMembers(&response);
        return UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    retval = response.results[0];
    UA_DeleteNodesResponse_deleteMembers(&response);
    return retval;
}